

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void __thiscall
cmSystemToolsArgV::Store
          (cmSystemToolsArgV *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  char **ppcVar1;
  char **ppcVar2;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ppcVar1 = this->ArgV;
  if ((ppcVar1 != (char **)0x0) && (*ppcVar1 != (char *)0x0)) {
    do {
      ppcVar2 = ppcVar1 + 1;
      std::__cxx11::string::string((string *)&local_48,*ppcVar1,&local_49);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,&local_48
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      ppcVar1 = ppcVar2;
    } while (*ppcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void Store(std::vector<std::string>& args) const
  {
    for (char** arg = this->ArgV; arg && *arg; ++arg) {
      args.push_back(*arg);
    }
  }